

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O0

int connectToServer(char *fileName)

{
  int __fd;
  uint *puVar1;
  size_t sVar2;
  char *in_RDI;
  sockaddr_un addr;
  int cc;
  int sock;
  sockaddr local_86 [6];
  int local_18;
  int local_14;
  char *local_10;
  int local_4;
  
  local_14 = 0xffffffff;
  local_10 = in_RDI;
  local_14 = socket(1,1,0);
  if (local_14 < 0) {
    puVar1 = (uint *)__errno_location();
    printf("UNIX domain socket create failed (errno=%d)\n",(ulong)*puVar1);
    local_4 = -1;
  }
  else {
    strcpy(local_86[0].sa_data,local_10);
    __fd = local_14;
    local_86[0].sa_family = 1;
    sVar2 = strlen(local_86[0].sa_data);
    local_18 = connect(__fd,local_86,(int)sVar2 + 2);
    if (local_18 < 0) {
      close(local_14);
      local_4 = -1;
    }
    else {
      local_4 = local_14;
    }
  }
  return local_4;
}

Assistant:

static int connectToServer(const char* fileName)
{
    int sock = -1;
    int cc;

    struct sockaddr_un addr;
    
    sock = socket(AF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        printf("UNIX domain socket create failed (errno=%d)\n", errno);
        return -1;
    }

    /* connect to socket; fails if file doesn't exist */
    strcpy(addr.sun_path, fileName);    // max 108 bytes
    addr.sun_family = AF_UNIX;
    cc = connect(sock, (struct sockaddr*) &addr, SUN_LEN(&addr));
    if (cc < 0) {
        // ENOENT means socket file doesn't exist
        // ECONNREFUSED means socket exists but nobody is listening
        //LOGW("AF_UNIX connect failed for '%s': %s\n",
        //    fileName, strerror(errno));
        close(sock);
        return -1;
    }

    return sock;
}